

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuickprof.cpp
# Opt level: O1

btScalar __thiscall btClock::getTimeSeconds(btClock *this)

{
  timeval currentTime;
  timeval local_20;
  
  gettimeofday(&local_20,(__timezone_ptr_t)0x0);
  return (float)(ulong)((local_20.tv_usec - (this->m_data->mStartTime).tv_usec) +
                       (local_20.tv_sec - (this->m_data->mStartTime).tv_sec) * 1000000) * 1e-06;
}

Assistant:

btScalar btClock::getTimeSeconds()
{
	static const btScalar microseconds_to_seconds = btScalar(0.000001);
	return btScalar(getTimeMicroseconds()) * microseconds_to_seconds;
}